

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O2

void __thiscall CVmSrcfEntry::alloc_line_records(CVmSrcfEntry *this,ulong cnt)

{
  CVmSrcfLine *pCVar1;
  size_t __size;
  
  if (this->lines_alo_ < cnt) {
    __size = cnt << 4;
    if (__size >> 0x20 != 0) {
      if (0xffffffe < this->lines_alo_) {
        return;
      }
      __size = 0xfffffff0;
      cnt = 0xfffffff;
    }
    if (this->lines_ == (CVmSrcfLine *)0x0) {
      pCVar1 = (CVmSrcfLine *)malloc(__size);
    }
    else {
      pCVar1 = (CVmSrcfLine *)realloc(this->lines_,__size);
    }
    this->lines_ = pCVar1;
    this->lines_alo_ = cnt;
  }
  return;
}

Assistant:

void CVmSrcfEntry::alloc_line_records(ulong cnt)
{
    ulong siz;
    
    /* 
     *   if the current array size is already big enough for the given
     *   count, there's nothing to do 
     */
    if (cnt <= lines_alo_)
        return;

    /* calculate the allocation size */
    siz = cnt * sizeof(lines_[0]);

    /* 
     *   if the new size exceeds the maximum local system's architectural
     *   limit for a single allocation, restrict the size to the maximum
     *   allocation 
     */
    if (siz > OSMALMAX)
    {
        /* recalculate the size for the maximum architectural allocation */
        cnt = OSMALMAX / sizeof(lines_[0]);
        siz = cnt * sizeof(lines_[0]);

        /* if we're already there, ignore the request */
        if (cnt <= lines_alo_)
            return;
    }

    /* allocate or reallocate the line record array */
    if (lines_ == 0)
        lines_ = (CVmSrcfLine *)t3malloc((size_t)siz);
    else
        lines_ = (CVmSrcfLine *)t3realloc(lines_, (size_t)siz);

    /* remember the new array size */
    lines_alo_ = cnt;
}